

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3ExprCodeTemp(Parse *pParse,Expr *pExpr,int *pReg)

{
  int iVar1;
  Expr *pEVar2;
  int *in_RDX;
  Expr *in_RSI;
  Parse *in_RDI;
  Expr *unaff_retaddr;
  int r1;
  int r2;
  int in_stack_000001bc;
  Expr *in_stack_000001c0;
  Parse *in_stack_000001c8;
  int local_1c;
  
  pEVar2 = sqlite3ExprSkipCollate(in_RSI);
  if (((in_RDI->okConstFactor == '\0') || (pEVar2->op == 0xa4)) ||
     (iVar1 = sqlite3ExprIsConstantNotJoin((Expr *)0x19f179), iVar1 == 0)) {
    iVar1 = sqlite3GetTempReg(in_RDI);
    local_1c = sqlite3ExprCodeTarget(in_stack_000001c8,in_stack_000001c0,in_stack_000001bc);
    if (local_1c == iVar1) {
      *in_RDX = iVar1;
    }
    else {
      sqlite3ReleaseTempReg(in_RDI,iVar1);
      *in_RDX = 0;
    }
  }
  else {
    *in_RDX = 0;
    local_1c = sqlite3ExprCodeAtInit(_r1,unaff_retaddr,(int)((ulong)in_RDI >> 0x20));
  }
  return local_1c;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprCodeTemp(Parse *pParse, Expr *pExpr, int *pReg){
  int r2;
  pExpr = sqlite3ExprSkipCollate(pExpr);
  if( ConstFactorOk(pParse)
   && pExpr->op!=TK_REGISTER
   && sqlite3ExprIsConstantNotJoin(pExpr)
  ){
    *pReg  = 0;
    r2 = sqlite3ExprCodeAtInit(pParse, pExpr, -1);
  }else{
    int r1 = sqlite3GetTempReg(pParse);
    r2 = sqlite3ExprCodeTarget(pParse, pExpr, r1);
    if( r2==r1 ){
      *pReg = r1;
    }else{
      sqlite3ReleaseTempReg(pParse, r1);
      *pReg = 0;
    }
  }
  return r2;
}